

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O0

void __thiscall QuickConnection::ConnectToServer(QuickConnection *this)

{
  bool bVar1;
  int iVar2;
  pointer pQVar3;
  undefined4 extraout_var;
  uint64_t uVar4;
  QuickHello local_1d;
  QuicTime QStack_18;
  QuickHello msg;
  QuickConnection *this_local;
  
  bVar1 = std::operator==(&this->_clock,(nullptr_t)0x0);
  if (!bVar1) {
    pQVar3 = std::unique_ptr<quic::QuicClock,_std::default_delete<quic::QuicClock>_>::operator->
                       (&this->_clock);
    iVar2 = (*pQVar3->_vptr_QuicClock[3])();
    QStack_18.time_ = CONCAT44(extraout_var,iVar2);
    uVar4 = quic::QuicTime::ToDebuggingValue(&stack0xffffffffffffffe8);
    this->_reconnect_time = uVar4;
    QuickHello::QuickHello(&local_1d);
    local_1d.session_id = this->_session_id;
    Send(this,&local_1d,5);
  }
  return;
}

Assistant:

void QuickConnection::ConnectToServer()
{
	if (_clock == nullptr)
		return;
	_reconnect_time = _clock->Now().ToDebuggingValue();
	QuickHello msg;
	msg.session_id = _session_id;
	Send(&msg, sizeof(msg));
}